

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall TypeTest_InvalidSupertype_Test::TestBody(TypeTest_InvalidSupertype_Test *this)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar2;
  char *in_R9;
  pointer *__ptr;
  initializer_list<wasm::Field> __l;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_88;
  byte local_70;
  TypeBuilder local_68;
  TypeBuilder builder;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  ::wasm::TypeBuilder::TypeBuilder(&local_68,2);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_68,0);
  local_30 = (undefined1  [8])0x2;
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_30;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_58,__l,
             (allocator_type *)&local_20);
  local_88._0_8_ = local_58;
  local_88._8_8_ = pbStack_50;
  local_88._16_8_ = local_48._M_allocated_capacity;
  local_58 = (undefined1  [8])0x0;
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48._M_allocated_capacity = 0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_68,(Struct *)0x0);
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  if (local_58 != (undefined1  [8])0x0) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity - (long)local_58);
  }
  local_88._0_8_ = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_68,(Struct *)0x1);
  if ((void *)local_88._0_8_ != (void *)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_68);
  ::wasm::TypeBuilder::setSubType(&local_68,1,uVar1,1);
  ::wasm::TypeBuilder::build();
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70 == 0) {
    local_30[0] = (internal)(local_70 != 0);
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)local_30,(AssertionResult *)"result","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&builder,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0xf8,(char *)local_58);
    testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
    if (local_58 != (undefined1  [8])&local_48) {
      operator_delete((void *)local_58,(ulong)(local_48._M_allocated_capacity + 1));
    }
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
    if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_28,local_28);
    }
  }
  local_30[0] = (internal)(local_70 == 1);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70 == 1) {
    local_30._0_4_ = 1;
    testing::internal::CmpHelperEQ<wasm::TypeBuilder::ErrorReason,wasm::TypeBuilder::ErrorReason>
              ((internal *)local_58,"error->reason","TypeBuilder::ErrorReason::InvalidSupertype",
               (ErrorReason *)(local_88._M_first._M_storage._M_storage + 8),(ErrorReason *)local_30)
    ;
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (pbStack_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xfc,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)local_30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
      if (local_30 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_50,pbStack_50);
    }
    local_30._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_58,"error->index","1u",(unsigned_long *)&local_88,(uint *)local_30)
    ;
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (pbStack_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xfd,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)local_30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
      if (local_30 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001dadf7;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_50;
    __ptr_00 = pbStack_50;
  }
  else {
    testing::Message::Message((Message *)&local_20);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_28;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)local_30,(AssertionResult *)0x27827d,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&builder,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0xfb,(char *)local_58);
    testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
    if (local_58 != (undefined1  [8])&local_48) {
      operator_delete((void *)local_58,(ulong)(local_48._M_allocated_capacity + 1));
    }
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
    __ptr_00 = local_28;
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001dadf7;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_001dadf7:
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_70]._M_data)
            ((anon_class_1_0_00000001 *)local_58,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&local_88._M_first);
  ::wasm::TypeBuilder::~TypeBuilder(&local_68);
  return;
}

Assistant:

TEST_F(TypeTest, InvalidSupertype) {
  TypeBuilder builder(2);
  builder.createRecGroup(0, 2);
  builder[0] = Struct({Field(Type::i32, Immutable)});
  builder[1] = Struct{};
  builder[1].subTypeOf(builder[0]);

  auto result = builder.build();
  EXPECT_FALSE(result);

  const auto* error = result.getError();
  ASSERT_TRUE(error);
  EXPECT_EQ(error->reason, TypeBuilder::ErrorReason::InvalidSupertype);
  EXPECT_EQ(error->index, 1u);
}